

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O3

PrimInfo *
embree::sse2::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,Geometry *geometry,uint geomID,size_t numPrimRefs,
          mvector<PrimRef> *prims,BuildProgressMonitor *progressMonitor)

{
  uint uVar1;
  size_t sVar2;
  char cVar3;
  int iVar4;
  task *ptVar5;
  size_t sVar6;
  runtime_error *prVar7;
  _func_int **pp_Var8;
  size_t sVar9;
  size_t *psVar10;
  _func_int **pp_Var11;
  undefined1 (*pauVar12) [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  size_t taskCount;
  task_group_context context;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  _func_int **local_2968;
  ulong **local_2960;
  task_traits local_2958;
  uint local_294c;
  Geometry *local_2948;
  ulong local_2940 [2];
  BuildProgressMonitor *local_2930;
  mvector<PrimRef> *local_2928;
  size_t local_2920;
  Geometry **local_2918;
  mvector<PrimRef> *local_2910;
  uint *local_2908;
  ulong *local_2900;
  ulong *local_28f8;
  undefined1 *local_28f0;
  undefined1 (*local_28e8) [16];
  Geometry ***local_28e0;
  undefined8 local_28d8;
  undefined4 local_28d0;
  wait_context local_28c8;
  task_group_context local_28b8;
  undefined1 local_2838 [5192];
  size_t asStack_13f0 [632];
  
  local_294c = geomID;
  local_2948 = geometry;
  local_2930 = progressMonitor;
  local_2920 = numPrimRefs;
  (**progressMonitor->_vptr_BuildProgressMonitor)();
  uVar1 = geometry->numPrimitives;
  local_2940[1] = 0;
  local_2940[0] = (ulong)uVar1;
  local_2928 = prims;
  local_2918 = &local_2948;
  local_2910 = prims;
  local_2908 = &local_294c;
  iVar4 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  pp_Var11 = (_func_int **)((ulong)uVar1 + 0x3ff >> 10);
  if ((_func_int **)(long)iVar4 < pp_Var11) {
    pp_Var11 = (_func_int **)(long)iVar4;
  }
  pp_Var8 = (_func_int **)0x40;
  if (pp_Var11 < (_func_int **)0x40) {
    pp_Var8 = pp_Var11;
  }
  pauVar12 = (undefined1 (*) [16])local_2838;
  local_28b8.my_version = proxy_support;
  local_28b8.my_traits = (context_traits)0x4;
  local_28b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_28b8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_28b8.my_name = CUSTOM_CTX;
  local_2968 = pp_Var8;
  local_2900 = local_2940 + 1;
  local_28f8 = local_2940;
  local_28f0 = (undefined1 *)&local_2968;
  local_28e8 = pauVar12;
  local_28e0 = &local_2918;
  tbb::detail::r1::initialize(&local_28b8);
  local_2960 = &local_2900;
  if (pp_Var11 != (_func_int **)0x0) {
    local_2958.m_version_and_traits = 0;
    ptVar5 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2958,0xc0);
    ptVar5->m_reserved[3] = 0;
    ptVar5->m_reserved[4] = 0;
    ptVar5->m_reserved[1] = 0;
    ptVar5->m_reserved[2] = 0;
    (ptVar5->super_task_traits).m_version_and_traits = 0;
    ptVar5->m_reserved[0] = 0;
    ptVar5->m_reserved[5] = 0;
    ptVar5->_vptr_task = (_func_int **)&PTR__task_02189e88;
    ptVar5[1]._vptr_task = pp_Var8;
    ptVar5[1].super_task_traits.m_version_and_traits = 0;
    ptVar5[1].m_reserved[0] = 1;
    ptVar5[1].m_reserved[1] = (uint64_t)&local_2960;
    ptVar5[1].m_reserved[2] = 0;
    ptVar5[1].m_reserved[3] = 1;
    iVar4 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)&ptVar5[2]._vptr_task = 0;
    *(undefined1 *)((long)&ptVar5[2]._vptr_task + 4) = 5;
    ptVar5[1].m_reserved[5] = (long)iVar4 * 2 & 0x7ffffffffffffffe;
    ptVar5[2].super_task_traits.m_version_and_traits = local_2958.m_version_and_traits;
    local_28d8 = 0;
    local_28d0 = 1;
    local_28c8.m_version_and_traits = 1;
    local_28c8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1
    ;
    ptVar5[1].m_reserved[4] = (uint64_t)&local_28d8;
    tbb::detail::r1::execute_and_wait(ptVar5,&local_28b8,&local_28c8,&local_28b8);
  }
  cVar3 = tbb::detail::r1::is_group_execution_cancelled(&local_28b8);
  if (cVar3 != '\0') {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"task cancelled");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_28b8);
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  aVar13 = _DAT_01f7aa00;
  aVar14 = _DAT_01f7a9f0;
  aVar15 = _DAT_01f7aa00;
  aVar16 = _DAT_01f7a9f0;
  if (local_2968 == (_func_int **)0x0) {
    sVar6 = 0;
  }
  else {
    sVar9 = 0;
    sVar6 = 0;
    pp_Var11 = local_2968;
    do {
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar12 + 0x140) = aVar16;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar12 + 0x141) = aVar13;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar12 + 0x142) = aVar14;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar12 + 0x143) = aVar15;
      sVar2 = __return_storage_ptr__->end;
      *(size_t *)pauVar12[0x144] = __return_storage_ptr__->begin;
      *(size_t *)(pauVar12[0x144] + 8) = sVar2;
      aVar16.m128 = (__m128)minps(aVar16.m128,*pauVar12);
      aVar13.m128 = (__m128)maxps(aVar13.m128,pauVar12[1]);
      aVar14.m128 = (__m128)minps(aVar14.m128,pauVar12[2]);
      aVar15.m128 = (__m128)maxps(aVar15.m128,pauVar12[3]);
      sVar9 = sVar9 + *(long *)pauVar12[4];
      sVar6 = sVar6 + *(long *)(pauVar12[4] + 8);
      __return_storage_ptr__->begin = sVar9;
      __return_storage_ptr__->end = sVar6;
      pauVar12 = pauVar12 + 5;
      pp_Var11 = (_func_int **)((long)pp_Var11 + -1);
    } while (pp_Var11 != (_func_int **)0x0);
    sVar6 = sVar6 - sVar9;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar16;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar13;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar14;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar15;
  if (sVar6 != local_2920) {
    (**local_2930->_vptr_BuildProgressMonitor)(local_2930,0);
    uVar1 = local_2948->numPrimitives;
    local_2918 = &local_2948;
    local_2910 = local_2928;
    local_2908 = &local_294c;
    local_2940[1] = 0;
    local_2940[0] = (ulong)uVar1;
    iVar4 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    pp_Var11 = (_func_int **)((ulong)uVar1 + 0x3ff >> 10);
    if ((_func_int **)(long)iVar4 < pp_Var11) {
      pp_Var11 = (_func_int **)(long)iVar4;
    }
    pp_Var8 = (_func_int **)0x40;
    if (pp_Var11 < (_func_int **)0x40) {
      pp_Var8 = pp_Var11;
    }
    local_2900 = local_2940 + 1;
    local_28f8 = local_2940;
    local_28e8 = (undefined1 (*) [16])local_2838;
    local_28e0 = &local_2918;
    local_28b8.my_version = proxy_support;
    local_28b8.my_traits = (context_traits)0x4;
    local_28b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_28b8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_28b8.my_name = CUSTOM_CTX;
    local_2968 = pp_Var8;
    local_28f0 = (undefined1 *)&local_2968;
    tbb::detail::r1::initialize(&local_28b8);
    local_2960 = &local_2900;
    if (pp_Var11 != (_func_int **)0x0) {
      local_2958.m_version_and_traits = 0;
      ptVar5 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2958,0xc0);
      ptVar5->m_reserved[3] = 0;
      ptVar5->m_reserved[4] = 0;
      ptVar5->m_reserved[1] = 0;
      ptVar5->m_reserved[2] = 0;
      (ptVar5->super_task_traits).m_version_and_traits = 0;
      ptVar5->m_reserved[0] = 0;
      ptVar5->m_reserved[5] = 0;
      ptVar5->_vptr_task = (_func_int **)&PTR__task_02189ed0;
      ptVar5[1]._vptr_task = pp_Var8;
      ptVar5[1].super_task_traits.m_version_and_traits = 0;
      ptVar5[1].m_reserved[0] = 1;
      ptVar5[1].m_reserved[1] = (uint64_t)&local_2960;
      ptVar5[1].m_reserved[2] = 0;
      ptVar5[1].m_reserved[3] = 1;
      iVar4 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      *(undefined4 *)&ptVar5[2]._vptr_task = 0;
      *(undefined1 *)((long)&ptVar5[2]._vptr_task + 4) = 5;
      ptVar5[1].m_reserved[5] = (long)iVar4 * 2 & 0x7ffffffffffffffe;
      ptVar5[2].super_task_traits.m_version_and_traits = local_2958.m_version_and_traits;
      local_28d8 = 0;
      local_28d0 = 1;
      local_28c8.m_version_and_traits = 1;
      local_28c8.m_ref_count.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)1;
      ptVar5[1].m_reserved[4] = (uint64_t)&local_28d8;
      tbb::detail::r1::execute_and_wait(ptVar5,&local_28b8,&local_28c8,&local_28b8);
    }
    cVar3 = tbb::detail::r1::is_group_execution_cancelled(&local_28b8);
    if (cVar3 != '\0') {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"task cancelled");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_28b8);
    aVar13 = _DAT_01f7a9f0;
    aVar14 = _DAT_01f7aa00;
    aVar15 = _DAT_01f7aa00;
    aVar16 = _DAT_01f7a9f0;
    if (local_2968 == (_func_int **)0x0) {
      sVar6 = 0;
      sVar9 = 0;
    }
    else {
      psVar10 = asStack_13f0;
      sVar9 = 0;
      sVar6 = 0;
      do {
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -9) = aVar16;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -7) = aVar15;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -5) = aVar13;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -3) = aVar14;
        psVar10[-1] = sVar6;
        *psVar10 = sVar9;
        aVar16.m128 = (__m128)minps(aVar16.m128,*(undefined1 (*) [16])(psVar10 + -0x289));
        aVar15.m128 = (__m128)maxps(aVar15.m128,*(undefined1 (*) [16])(psVar10 + -0x287));
        aVar13.m128 = (__m128)minps(aVar13.m128,*(undefined1 (*) [16])(psVar10 + -0x285));
        aVar14.m128 = (__m128)maxps(aVar14.m128,*(undefined1 (*) [16])(psVar10 + -0x283));
        sVar6 = sVar6 + psVar10[-0x281];
        sVar9 = sVar9 + psVar10[-0x280];
        psVar10 = psVar10 + 10;
        local_2968 = (_func_int **)((long)local_2968 + -1);
      } while (local_2968 != (_func_int **)0x0);
    }
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = aVar16;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = aVar15;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = aVar13;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = aVar14;
    __return_storage_ptr__->begin = sVar6;
    __return_storage_ptr__->end = sVar9;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(Geometry* geometry, unsigned int geomID, const size_t numPrimRefs, mvector<PrimRef>& prims, BuildProgressMonitor& progressMonitor)
    {
      ParallelPrefixSumState<PrimInfo> pstate;
      
      /* first try */
      progressMonitor(0);
      PrimInfo pinfo = parallel_prefix_sum( pstate, size_t(0), geometry->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
          return geometry->createPrimRefArray(prims,r,r.begin(),geomID);
        }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });

      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
      {
        progressMonitor(0);
        pinfo = parallel_prefix_sum( pstate, size_t(0), geometry->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
          return geometry->createPrimRefArray(prims,r,base.size(),geomID);
        }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      }
      return pinfo;
    }